

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NewtFile.c
# Opt level: O0

newtRef NsLoadBinary(newtRefArg rcvr,newtRefArg r)

{
  _Bool _Var1;
  char *__filename;
  FILE *__stream;
  size_t __size;
  uint8_t *data_00;
  newtRef klass;
  uint8_t *data;
  size_t size;
  FILE *f;
  char *filename;
  newtRefArg r_local;
  newtRefArg rcvr_local;
  
  _Var1 = NewtRefIsString(r);
  if (_Var1) {
    __filename = NewtRefToString(r);
    __stream = fopen(__filename,"rb");
    if (__stream == (FILE *)0x0) {
      rcvr_local = NewtThrow(-49000,r);
    }
    else {
      fseek(__stream,0,2);
      __size = ftell(__stream);
      fseek(__stream,0,0);
      data_00 = (uint8_t *)malloc(__size);
      fread(data_00,__size,1,__stream);
      fclose(__stream);
      klass = NewtMakeSymbol("data");
      rcvr_local = NewtMakeBinary(klass,data_00,(uint32_t)__size,false);
    }
  }
  else {
    rcvr_local = NewtThrow(-0xbd12,r);
  }
  return rcvr_local;
}

Assistant:

newtRef NsLoadBinary(newtRefArg rcvr, newtRefArg r)
{
    if (NewtRefIsString(r)) {
        char *filename = NewtRefToString(r);
        FILE *f = fopen(filename, "rb");
        if (!f)
            return NewtThrow(kNErrFileNotFound, r);
        fseek(f, 0, SEEK_END);
        size_t size = ftell(f);
        fseek(f, 0, SEEK_SET);
        uint8_t *data = (uint8_t*)malloc(size);
        /*int err = (int)*/ fread(data, size, 1, f);
        fclose(f);
        return NewtMakeBinary(NSSYM(data), data, (uint32_t)size, false);
    } else {
        return NewtThrow(kNErrNotAString, r);
    }
}